

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O3

pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
* __thiscall
jessilib::
word_split_once<std::__cxx11::u16string,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,char16_t>
          (pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
          begin,__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                end,char16_t in_whitespace)

{
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar3;
  char16_t cVar4;
  jessilib *pjVar5;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *this_00;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_90;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_70;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_50;
  
  paVar2 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = L'\0';
  paVar3 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = L'\0';
  if (this < begin._M_current) {
    cVar4 = (char16_t)end._M_current;
    do {
      pjVar5 = this;
      if (*(char16_t *)this != cVar4) break;
      this = this + 2;
      pjVar5 = this;
    } while (this != (jessilib *)begin._M_current);
    do {
      local_70._M_dataplus._M_p = (pointer)paVar2;
      local_50._M_dataplus._M_p = (pointer)paVar3;
      if (this == (jessilib *)begin._M_current) goto LAB_003f025b;
      if (*(char16_t *)this == cVar4) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::u16string::
        _M_construct<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>>
                  ((u16string *)&local_90,pjVar5,this);
        std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
        ::operator=(&local_70,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity * 2 + 2);
        }
        goto LAB_003f02cb;
      }
      this = this + 2;
    } while( true );
  }
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first).field_2._M_local_buf[0] = L'\0';
  *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 2) =
       CONCAT26(local_70.field_2._M_local_buf[4],local_70.field_2._M_allocated_capacity._2_6_);
  *(undefined4 *)((long)&(__return_storage_ptr__->first).field_2 + 10) = local_70.field_2._10_4_;
  (__return_storage_ptr__->first).field_2._M_local_buf[7] = local_70.field_2._M_local_buf[7];
  (__return_storage_ptr__->first)._M_string_length = 0;
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = L'\0';
  *(ulong *)((long)&(__return_storage_ptr__->second).field_2 + 2) =
       CONCAT26(local_50.field_2._M_local_buf[4],local_50.field_2._M_allocated_capacity._2_6_);
  *(undefined4 *)((long)&(__return_storage_ptr__->second).field_2 + 10) = local_50.field_2._10_4_;
  (__return_storage_ptr__->second).field_2._M_local_buf[7] = local_50.field_2._M_local_buf[7];
  local_50._M_string_length = 0;
  goto LAB_003f021a;
LAB_003f025b:
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::u16string::
  _M_construct<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>>
            ((u16string *)&local_90,pjVar5,begin._M_current);
  this_00 = &local_70;
  goto LAB_003f02fb;
  while (*(char16_t *)this == cVar4) {
LAB_003f02cb:
    this = this + 2;
    if (this == (jessilib *)begin._M_current) break;
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::u16string::
  _M_construct<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>>
            ((u16string *)&local_90,this,begin._M_current);
  this_00 = &local_50;
LAB_003f02fb:
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  operator=(this_00,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity * 2 + 2);
  }
  paVar1 = &(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_70._M_dataplus._M_p == paVar2) {
    paVar1->_M_allocated_capacity =
         CONCAT62(local_70.field_2._M_allocated_capacity._2_6_,local_70.field_2._M_local_buf[0]);
    *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 8) =
         CONCAT26(local_70.field_2._M_local_buf[7],
                  CONCAT42(local_70.field_2._10_4_,local_70.field_2._M_local_buf[4]));
  }
  else {
    (__return_storage_ptr__->first)._M_dataplus._M_p = local_70._M_dataplus._M_p;
    (__return_storage_ptr__->first).field_2._M_allocated_capacity =
         CONCAT62(local_70.field_2._M_allocated_capacity._2_6_,local_70.field_2._M_local_buf[0]);
  }
  (__return_storage_ptr__->first)._M_string_length = local_70._M_string_length;
  paVar2 = &(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_50._M_dataplus._M_p == paVar3) {
    paVar2->_M_allocated_capacity =
         CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,local_50.field_2._M_local_buf[0]);
    *(ulong *)((long)&(__return_storage_ptr__->second).field_2 + 8) =
         CONCAT26(local_50.field_2._M_local_buf[7],
                  CONCAT42(local_50.field_2._10_4_,local_50.field_2._M_local_buf[4]));
  }
  else {
    (__return_storage_ptr__->second)._M_dataplus._M_p = local_50._M_dataplus._M_p;
    (__return_storage_ptr__->second).field_2._M_allocated_capacity =
         CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,local_50.field_2._M_local_buf[0]);
  }
LAB_003f021a:
  (__return_storage_ptr__->second)._M_string_length = local_50._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, ElementT in_whitespace) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	while (begin != end
		&& *begin == in_whitespace) {
		++begin;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_whitespace) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& *itr == in_whitespace) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}